

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_3.h
# Opt level: O0

int sort_5_3::adjheap_3(int *a,int i,int n)

{
  int iVar1;
  code *pcVar2;
  int iVar3;
  int local_20;
  int j;
  int t;
  int n_local;
  int i_local;
  int *a_local;
  
  iVar1 = a[i];
  iVar3 = i * 2;
  t = i;
  while (local_20 = iVar3 + 1, local_20 < n) {
    if ((iVar3 + 2 < n) && (a[local_20] < a[iVar3 + 2])) {
      local_20 = iVar3 + 2;
    }
    if (a[local_20] <= iVar1) break;
    swap_(a + local_20,a + t);
    t = local_20;
    iVar3 = local_20 * 2;
  }
  pcVar2 = (code *)invalidInstructionException();
  (*pcVar2)();
}

Assistant:

int adjheap_3(int *a, int i, int n) {
        int t = a[i];
        for (int j = i * 2 + 1; j < n; j = j * 2 + 1) {
            if (j + 1 < n && a[j] < a[j + 1])
                j++;
            if (a[j] > t) {
                swap_(&a[j], &a[i]);
                i = j;
            } else
                break;
        }
    }